

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

void __thiscall
TPZBlockDiagonal<double>::Initialize(TPZBlockDiagonal<double> *this,TPZVec<int> *blocksize)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  int64_t iVar7;
  int64_t newsize;
  double local_38;
  
  lVar2 = blocksize->fNElements;
  TPZVec<int>::operator=(&this->fBlockSize,blocksize);
  local_38 = 0.0;
  TPZVec<long>::Resize(&this->fBlockPos,lVar2 + 1,(long *)&local_38);
  if (lVar2 < 1) {
    newsize = 0;
    iVar7 = 0;
  }
  else {
    piVar3 = blocksize->fStore;
    plVar4 = (this->fBlockPos).fStore;
    lVar5 = *plVar4;
    lVar6 = 0;
    iVar7 = 0;
    newsize = 0;
    do {
      iVar1 = piVar3[lVar6];
      iVar7 = iVar7 + iVar1;
      lVar5 = lVar5 + (ulong)(uint)(iVar1 * iVar1);
      plVar4[lVar6 + 1] = lVar5;
      lVar6 = lVar6 + 1;
      newsize = newsize + (ulong)(uint)(iVar1 * iVar1);
    } while (lVar2 != lVar6);
  }
  local_38 = 0.0;
  TPZVec<double>::Fill(&this->fStorage,&local_38,0,-1);
  local_38 = 0.0;
  TPZVec<double>::Resize(&this->fStorage,newsize,&local_38);
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = iVar7;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = iVar7;
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Initialize(const TPZVec<int> &blocksize){
	int64_t nblock = blocksize.NElements();
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Number of blocks \t" << nblock;
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	fBlockSize = blocksize;
	fBlockPos.Resize(nblock+1,0); 
	int64_t b;
	int64_t ndata = 0;
	int64_t neq = 0;
	int bsize;
	for(b=0; b<nblock; b++) {
		bsize = blocksize[b];
		fBlockPos[b+1] = fBlockPos[b]+bsize*bsize;
		ndata += bsize*bsize;
		neq += bsize;
	}
#ifdef PZ_LOG
	if(ndata > 10000000)
	{
		std::stringstream sout;
		sout << "Calling fStorage.Resize(ndata,0.) with ndata = " << ndata;
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	
	fStorage.Fill(0.,0);
	fStorage.Resize(ndata,0.);
	this->fDecomposed = 0;
	this->fRow = neq;
	this->fCol = neq;
}